

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::LocalClient::BlockedCall::BlockedCall
          (BlockedCall *this,PromiseFulfiller<kj::Promise<void>_> *fulfiller,LocalClient *client,
          uint64_t interfaceId,uint16_t methodId,CallContextHook *context)

{
  CallContextHook *context_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  LocalClient *client_local;
  PromiseFulfiller<kj::Promise<void>_> *fulfiller_local;
  BlockedCall *this_local;
  
  this->fulfiller = fulfiller;
  this->client = client;
  this->interfaceId = interfaceId;
  this->methodId = methodId;
  kj::Maybe<capnp::CallContextHook_&>::Maybe(&this->context,context);
  kj::Maybe<capnp::LocalClient::BlockedCall_&>::Maybe(&this->next);
  this->prev = client->blockedCallsEnd;
  kj::Maybe<capnp::LocalClient::BlockedCall_&>::operator=(this->prev,this);
  client->blockedCallsEnd = &this->next;
  return;
}

Assistant:

BlockedCall(kj::PromiseFulfiller<kj::Promise<void>>& fulfiller, LocalClient& client,
                uint64_t interfaceId, uint16_t methodId, CallContextHook& context)
        : fulfiller(fulfiller), client(client),
          interfaceId(interfaceId), methodId(methodId), context(context),
          prev(client.blockedCallsEnd) {
      *prev = *this;
      client.blockedCallsEnd = &next;
    }